

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  Test *pTVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  undefined4 in_register_0000003c;
  bool *pbVar11;
  char *pos;
  bool bVar12;
  option kLongOptions [2];
  string local_98;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 1;
  local_78._M_dataplus._M_p = "gtest_filter";
  local_78._M_string_length._0_4_ = 1;
  local_78._M_string_length._4_4_ = 0;
  iVar2 = getopt_long(CONCAT44(in_register_0000003c,argc),argv,"h",&local_78,0);
  pcVar4 = _optarg;
  bVar12 = iVar2 == -1;
  if (bVar12) {
    pcVar3 = "*";
  }
  else {
    pcVar5 = "*";
    if ((iVar2 == 1) && (pcVar3 = strchr(_optarg,0x3f), pcVar3 == (char *)0x0)) {
      pcVar5 = "*";
      while (pcVar3 = pcVar4, pcVar4 = strchr(pcVar3,0x3a), pcVar4 == (char *)0x0) {
        iVar2 = getopt_long(argc,argv,"h",&local_78,0);
        pcVar4 = _optarg;
        bVar12 = iVar2 == -1;
        if (bVar12) goto LAB_00175bc7;
        pcVar5 = pcVar3;
        if ((iVar2 != 1) || (pcVar3 = strchr(_optarg,0x3f), pcVar3 != (char *)0x0)) break;
      }
    }
    pcVar3 = pcVar5;
    fwrite("usage: ninja_tests [options]\n\noptions:\n  --gtest_filter=POSTIVE_PATTERN[-NEGATIVE_PATTERN]\n      Run tests whose names match the positive but not the negative pattern.\n      \'*\' matches any substring. (gtest\'s \':\', \'?\' are not implemented).\n"
           ,0xf1,1,_stderr);
  }
LAB_00175bc7:
  uVar7 = 1;
  if (bVar12) {
    lVar9 = (long)ntests;
    if (lVar9 < 1) {
      uVar7 = 0;
    }
    else {
      pcVar5 = strchr(pcVar3,0x2d);
      pcVar4 = "*";
      if (pcVar5 != pcVar3) {
        pcVar4 = pcVar3;
      }
      pcVar3 = "";
      if (pcVar5 != (char *)0x0) {
        pcVar3 = pcVar5 + 1;
      }
      lVar10 = 0;
      uVar7 = 0;
      do {
        pcVar5 = *(char **)((long)&tests[0].name + lVar10);
        bVar12 = anon_unknown.dwarf_18c278::PatternMatchesString(pcVar4,pcVar5);
        if (bVar12) {
          bVar12 = anon_unknown.dwarf_18c278::PatternMatchesString(pcVar3,pcVar5);
          bVar12 = !bVar12;
        }
        else {
          bVar12 = false;
        }
        *(bool *)(lVar10 + 0x1d95c0) = bVar12;
        uVar7 = uVar7 + bVar12;
        lVar10 = lVar10 + 0x18;
      } while (lVar9 * 0x18 != lVar10);
    }
    if (ntests < 1) {
      bVar12 = true;
    }
    else {
      bVar1 = true;
      bVar12 = true;
      pbVar11 = &tests[0].should_run;
      lVar9 = 0;
      uVar8 = 0;
      do {
        if (*pbVar11 == true) {
          uVar8 = uVar8 + 1;
          pTVar6 = (*((RegisteredTest *)(pbVar11 + -0x10))->factory)();
          (anonymous_namespace)::StringPrintf_abi_cxx11_
                    (&local_98,"[%d/%d] %s",(ulong)uVar8,(ulong)uVar7,*(char **)(pbVar11 + -8));
          LinePrinter::Print(&printer,&local_98,ELIDE);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          (*pTVar6->_vptr_Test[2])(pTVar6);
          (*pTVar6->_vptr_Test[4])(pTVar6);
          (*pTVar6->_vptr_Test[3])(pTVar6);
          bVar12 = bVar1;
          if (pTVar6->failed_ != false) {
            bVar12 = false;
          }
          (*pTVar6->_vptr_Test[1])(pTVar6);
          bVar1 = bVar12;
        }
        lVar9 = lVar9 + 1;
        pbVar11 = pbVar11 + 0x18;
      } while (lVar9 < ntests);
    }
    pcVar4 = "failed\n";
    if (bVar12) {
      pcVar4 = "passed\n";
    }
    pcVar3 = "failed\n";
    if (bVar12) {
      pcVar3 = "passed\n";
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar4,pcVar3 + 7);
    LinePrinter::PrintOnNewLine(&printer,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    uVar7 = (uint)(byte)~bVar12;
  }
  return uVar7;
}

Assistant:

int main(int argc, char **argv) {
  int tests_started = 0;

  const char* test_filter = "*";
  if (!ReadFlags(&argc, &argv, &test_filter))
    return 1;

  int nactivetests = 0;
  for (int i = 0; i < ntests; i++)
    if ((tests[i].should_run = TestMatchesFilter(tests[i].name, test_filter)))
      ++nactivetests;

  bool passed = true;
  for (int i = 0; i < ntests; i++) {
    if (!tests[i].should_run) continue;

    ++tests_started;
    testing::Test* test = tests[i].factory();
    printer.Print(
        StringPrintf("[%d/%d] %s", tests_started, nactivetests, tests[i].name),
        LinePrinter::ELIDE);
    test->SetUp();
    test->Run();
    test->TearDown();
    if (test->Failed())
      passed = false;
    delete test;
  }

  printer.PrintOnNewLine(passed ? "passed\n" : "failed\n");
  return passed ? EXIT_SUCCESS : EXIT_FAILURE;
}